

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
               (Proxy_Function_Base **t_func,Function_Params *plist,
               Type_Conversions_State *t_conversions)

{
  Proxy_Function_Base *pPVar1;
  pointer pTVar2;
  pair<const_chaiscript::Boxed_Value_*,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  pVar3;
  bool bVar4;
  pair<const_chaiscript::Boxed_Value_*,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  pVar5;
  
  pPVar1 = *t_func;
  if (pPVar1->m_arity == -1) {
    bVar4 = false;
  }
  else {
    pTVar2 = (pPVar1->m_types).
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)plist->m_end - (long)plist->m_begin >> 4 !=
        ((long)(pPVar1->m_types).
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x18 + -1) {
      __assert_fail("plist.size() == types.size() - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                    ,0x2bd,
                    "bool chaiscript::dispatch::detail::types_match_except_for_arithmetic(const FuncType &, const chaiscript::Function_Params &, const Type_Conversions_State &) [FuncType = const chaiscript::dispatch::Proxy_Function_Base *]"
                   );
    }
    pVar5 = std::
            __mismatch<chaiscript::Boxed_Value_const*,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,__gnu_cxx::__ops::_Iter_comp_iter<chaiscript::dispatch::detail::types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>(chaiscript::dispatch::Proxy_Function_Base_const*const&,chaiscript::Function_Params_const&,chaiscript::Type_Conversions_State_const&)::_lambda(chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&)_1_>>
                      (plist->m_begin,plist->m_end,pTVar2 + 1,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_include_chaiscript_dispatchkit_proxy_functions_hpp:706:30)>
                        )t_conversions);
    pVar3.second._M_current =
         (pPVar1->m_types).
         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pVar3.first = plist->m_end;
    bVar4 = pVar5 == pVar3;
  }
  return bVar4;
}

Assistant:

bool types_match_except_for_arithmetic(const FuncType &t_func,
                                             const chaiscript::Function_Params &plist,
                                             const Type_Conversions_State &t_conversions) noexcept {
        const std::vector<Type_Info> &types = t_func->get_param_types();

        if (t_func->get_arity() == -1) {
          return false;
        }

        assert(plist.size() == types.size() - 1);

        return std::mismatch(plist.begin(),
                             plist.end(),
                             types.begin() + 1,
                             [&](const Boxed_Value &bv, const Type_Info &ti) {
                               return Proxy_Function_Base::compare_type_to_param(ti, bv, t_conversions)
                                   || (bv.get_type_info().is_arithmetic() && ti.is_arithmetic());
                             })
            == std::make_pair(plist.end(), types.end());
      }